

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O3

opj_bool opj_encode_with_info
                   (opj_cinfo_t *cinfo,opj_cio_t *cio,opj_image_t *image,
                   opj_codestream_info_t *cstr_info)

{
  opj_bool oVar1;
  
  if (image != (opj_image_t *)0x0 && (cio != (opj_cio_t *)0x0 && cinfo != (opj_cinfo_t *)0x0)) {
    if (cinfo->codec_format == CODEC_JP2) {
      oVar1 = opj_jp2_encode((opj_jp2_t *)cinfo->jp2_handle,cio,image,cstr_info);
      return oVar1;
    }
    if (cinfo->codec_format == CODEC_J2K) {
      oVar1 = j2k_encode((opj_j2k_t *)cinfo->j2k_handle,cio,image,cstr_info);
      return oVar1;
    }
  }
  return 0;
}

Assistant:

opj_bool OPJ_CALLCONV opj_encode_with_info(opj_cinfo_t *cinfo, opj_cio_t *cio, opj_image_t *image, opj_codestream_info_t *cstr_info) {
	if(cinfo && cio && image) {
		switch(cinfo->codec_format) {
			case CODEC_J2K:
				return j2k_encode((opj_j2k_t*)cinfo->j2k_handle, cio, image, cstr_info);
			case CODEC_JP2:
				return opj_jp2_encode((opj_jp2_t*)cinfo->jp2_handle, cio, image, cstr_info);	    
			case CODEC_JPT:
			case CODEC_UNKNOWN:
			default:
				break;
		}
	}
	return OPJ_FALSE;
}